

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ssize_t __thiscall JetHead::Socket::read(Socket *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  ssize_t sVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  sockaddr *in_R9;
  socklen_t *in_stack_ffffffffffffff28;
  fd_set *__arr;
  uint __i;
  int numBytes;
  timeval timeout;
  fd_set readSet;
  int retCode;
  int len_local;
  void *buffer_local;
  Socket *this_local;
  
  if (this->mReadTimeout == 0) {
    if ((this->mSockStream & 1U) == 0) {
      sVar2 = recvfrom(this,__fd,(void *)((ulong)__buf & 0xffffffff),
                       (size_t)&this->mLastDatagramSender,0,in_R9,in_stack_ffffffffffffff28);
      this_local._4_4_ = (uint)sVar2;
    }
    else {
      sVar2 = ::read(this->mFd,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf);
      this_local._4_4_ = (uint)sVar2;
    }
  }
  else if (this->mReadTimeout < 0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
      readSet.fds_bits[(ulong)(uint)__arr - 1] = 0;
    }
    uVar3 = (ulong)((uint)this->mFd >> 6);
    readSet.fds_bits[uVar3 - 1] = 1L << ((byte)this->mFd & 0x3f) | readSet.fds_bits[uVar3 - 1];
    ___i = (long)this->mReadTimeout;
    timeout.tv_sec = 0;
    do {
      if (this->mReadTimeout == 0) {
        readSet.fds_bits[0xf]._0_4_ =
             select(0x400,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      }
      else {
        readSet.fds_bits[0xf]._0_4_ =
             select(0x400,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&__i);
      }
      if ((int)readSet.fds_bits[0xf] == 0) {
        this_local._4_4_ = 0xffffffff;
        goto LAB_0012fd62;
      }
      if ((int)readSet.fds_bits[0xf] != -1) {
        sVar2 = recv(this->mFd,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0x4000);
        this_local._4_4_ = (uint)sVar2;
        if ((int)this_local._4_4_ < 0) {
          this_local._4_4_ = 0xffffffff;
        }
        goto LAB_0012fd62;
      }
      piVar1 = __errno_location();
    } while (*piVar1 == 4);
    this_local._4_4_ = 0xffffffff;
  }
LAB_0012fd62:
  return (ulong)this_local._4_4_;
}

Assistant:

int Socket::read( void *buffer, int len )
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (mReadTimeout)
	{
		int retCode = 0;
		fd_set readSet;
		struct timeval timeout;
		int numBytes = 0;

		if( mReadTimeout < 0 ) 
		{
			return -1; // invalid timeout
		}

		FD_ZERO( &readSet );
		FD_SET( ( unsigned )mFd, &readSet );

		timeout.tv_sec = mReadTimeout;
		timeout.tv_usec = 0;

		while( true ) {
			if( mReadTimeout == 0 ) 
			{
				retCode = select( FD_SETSIZE, &readSet, NULL, NULL, NULL );
			} 
			else 
			{
				retCode = select( FD_SETSIZE, &readSet, NULL, NULL, &timeout );
			}

			if( retCode == 0 ) 
			{
				return -1; // timed out
			}
			if( retCode == -1 ) 
			{
				if( errno == EINTR )
					continue;
				
				return -1; // error
			} 
			else 
			{
				break; // continue with read 
			}
		}

		// read data
		numBytes = recv( mFd, buffer, len, MSG_NOSIGNAL );

		if( numBytes < 0 ) 
		{
			return -1; // socket error;
		}

		return numBytes;
	}
	else
	{
		if (not mSockStream)
		{
			return recvfrom(buffer, len, mLastDatagramSender);
		} else {
			return ::read(mFd, buffer, len);
		}
	}
}